

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRC.h
# Opt level: O2

uchar CRC::Finalize<unsigned_char,(unsigned_short)8>
                (uchar remainder,uchar finalXOR,bool reflectOutput)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,reflectOutput) != 0) {
    remainder = Reflect<unsigned_char>(remainder,8);
  }
  return remainder ^ finalXOR;
}

Assistant:

inline CRCType CRC::Finalize(CRCType remainder, CRCType finalXOR, bool reflectOutput)
{
    // For masking off the bits for the CRC (in the event that the number of bits in CRCType is larger than CRCWidth)
    static crcpp_constexpr CRCType BIT_MASK = (CRCType(1) << (CRCWidth - CRCType(1))) |
                                             ((CRCType(1) << (CRCWidth - CRCType(1))) - CRCType(1));

    if (reflectOutput)
    {
        remainder = Reflect(remainder, CRCWidth);
    }

    return (remainder ^ finalXOR) & BIT_MASK;
}